

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processQueryResponse(CommonCore *this,ActionMessage *message)

{
  ushort uVar1;
  pointer ptVar2;
  long lVar3;
  long lVar4;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *pvVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int ii;
  long lVar10;
  _Head_base<0UL,_helics::fileops::JsonMapBuilder,_false> *this_00;
  JsonMapBuilder *this_01;
  allocator<char> local_81;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *local_80;
  JsonMapBuilder *local_78;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  string str;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  uVar1 = message->counter;
  if (uVar1 == 0) {
    iVar7 = message->messageID;
    local_40._M_len = (message->payload).bufferSize;
    local_40._M_str = (char *)(message->payload).heap;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&str,&local_40,&local_81);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar7,&str);
  }
  else {
    ptVar2 = (this->mapBuilders).
             super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (uint)uVar1;
    if (((uint)(((long)(this->mapBuilders).
                       super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar2) / 0x60) & 0xffff)
        <= uVar8) {
      return;
    }
    local_80 = (vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               ((ulong)uVar8 * 0x60);
    this_00 = &ptVar2[uVar8].
               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
               .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>;
    local_40._M_len = (message->payload).bufferSize;
    local_40._M_str = (char *)(message->payload).heap;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&str,&local_40,&local_81);
    bVar6 = fileops::JsonMapBuilder::addComponent(&this_00->_M_head_impl,&str,message->messageID);
    std::__cxx11::string::~string((string *)&str);
    if (!bVar6) {
      return;
    }
    fileops::JsonMapBuilder::generate_abi_cxx11_(&str,&this_00->_M_head_impl);
    if (message->counter == 8) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                 "{\"status\":true}");
    }
    pvVar5 = local_80;
    local_80 = (vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               ((long)&(ptVar2->
                       super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       ).
                       super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       .
                       super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
               + (long)local_80);
    local_70 = &this->activeQueries;
    lVar9 = 0;
    lVar10 = 0;
    local_78 = &this_00->_M_head_impl;
    while( true ) {
      lVar3 = *(long *)((long)&(ptVar2->
                               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               ).
                               super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               .
                               super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                       + (long)pvVar5);
      lVar4 = *(long *)((long)&(ptVar2->
                               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               ).
                               super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               .
                               super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                       + (long)pvVar5 + 8U);
      if ((int)((lVar4 - lVar3) / 0xb8) + -1 <= lVar10) break;
      if (*(int *)(lVar3 + 0x10 + lVar9) == (this->super_BrokerBase).global_broker_id_local.gid) {
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::setDelayedValue(local_70,*(int *)(lVar3 + 4 + lVar9),&str);
      }
      else {
        SmallBuffer::operator=((SmallBuffer *)(lVar3 + lVar9 + 0x40),&str);
        routeMessage(this,(ActionMessage *)
                          ((long)(&(((local_80->
                                     super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->payload).buffer +
                                 0xffffffffffffffff) + lVar9));
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0xb8;
    }
    if (*(int *)(lVar4 + -0xa8) == -0x396fe ||
        *(int *)(lVar4 + -0xa8) == (this->super_BrokerBase).global_broker_id_local.gid) {
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue(local_70,*(int *)(lVar4 + -0xb4),&str);
      this_01 = local_78;
    }
    else {
      SmallBuffer::operator=((SmallBuffer *)(lVar4 + -0x78),&str);
      this_01 = local_78;
      routeMessage(this,(ActionMessage *)
                        (*(long *)((long)&(ptVar2->
                                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                          ).
                                          super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                          .
                                          super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                  + (long)pvVar5 + 8U) + -0xb8));
    }
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear(local_80);
    if (*(char *)&(this->mapBuilders).
                  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[message->counter].
                  super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                  .
                  super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                  .super__Tuple_impl<2UL,_helics::QueryReuse> == '\x01') {
      fileops::JsonMapBuilder::reset(this_01);
    }
    else {
      iVar7 = generateMapObjectCounter(this);
      *(int *)((long)&(ptVar2->
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl +
              (long)pvVar5 + 0x38U) = iVar7;
    }
  }
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void CommonCore::processQueryResponse(const ActionMessage& message)
{
    if (message.counter == GENERAL_QUERY) {
        activeQueries.setDelayedValue(message.messageID, std::string(message.payload.to_string()));
        return;
    }
    if (isValidIndex(message.counter, mapBuilders)) {
        auto& builder = std::get<0>(mapBuilders[message.counter]);
        auto& requesters = std::get<1>(mapBuilders[message.counter]);
        if (builder.addComponent(std::string(message.payload.to_string()), message.messageID)) {
            auto str = builder.generate();
            if (message.counter == GLOBAL_FLUSH) {
                str = "{\"status\":true}";
            }
            for (int ii = 0; ii < static_cast<int>(requesters.size()) - 1; ++ii) {
                if (requesters[ii].dest_id == global_broker_id_local) {
                    activeQueries.setDelayedValue(requesters[ii].messageID, str);
                } else {
                    requesters[ii].payload = str;
                    routeMessage(std::move(requesters[ii]));
                }
            }
            if (requesters.back().dest_id == global_broker_id_local ||
                requesters.back().dest_id == gDirectCoreId) {
                activeQueries.setDelayedValue(requesters.back().messageID, std::move(str));
            } else {
                requesters.back().payload = std::move(str);
                routeMessage(std::move(requesters.back()));
            }

            requesters.clear();
            if (std::get<2>(mapBuilders[message.counter]) == QueryReuse::DISABLED) {
                builder.reset();
            } else {
                builder.setCounterCode(generateMapObjectCounter());
            }
        }
    }
}